

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O2

void __thiscall
LatencyCollector::addLatency(LatencyCollector *this,string *lat_name,uint64_t lat_value)

{
  bool bVar1;
  LatencyItem *pLVar2;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  long lVar3;
  bool bVar4;
  ashared_ptr<MapWrapper> local_f8;
  MapWrapperSP new_map;
  MapWrapperSP expected;
  ashared_ptr<MapWrapper> local_60;
  
  local_f8.lock.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_f8.lock.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_f8.lock.super___mutex_base._M_mutex._8_8_ = 0;
  local_f8.lock.super___mutex_base._M_mutex._16_8_ = 0;
  local_f8.object._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_f8.lock.super___mutex_base._M_mutex.__align = 0;
  lVar3 = -0x10;
  do {
    ashared_ptr<MapWrapper>::operator=(&local_f8,&this->latestMap);
    pLVar2 = MapWrapper::get(*(MapWrapper **)local_f8.object._M_b._M_p,lat_name);
    if (pLVar2 != (LatencyItem *)0x0) {
      Histogram::add(&pLVar2->hist,lat_value);
      break;
    }
    this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)operator_new(0x38);
    this_00->_M_buckets = &this_00->_M_single_bucket;
    this_00->_M_bucket_count = 1;
    (this_00->_M_before_begin)._M_nxt = (_Hash_node_base *)0x0;
    this_00->_M_element_count = 0;
    (this_00->_M_rehash_policy)._M_max_load_factor = 1.0;
    (this_00->_M_rehash_policy)._M_next_resize = 0;
    this_00->_M_single_bucket = (__node_base_ptr)0x0;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(this_00,*(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          **)local_f8.object._M_b._M_p);
    ashared_ptr<MapWrapper>::ashared_ptr(&new_map,(MapWrapper *)this_00);
    pLVar2 = MapWrapper::addItem(*(MapWrapper **)new_map.object._M_b._M_p,lat_name);
    Histogram::add(&pLVar2->hist,lat_value);
    ashared_ptr<MapWrapper>::ashared_ptr(&expected,&local_f8);
    ashared_ptr<MapWrapper>::ashared_ptr(&local_60,&new_map);
    bVar1 = ashared_ptr<MapWrapper>::compare_exchange(&this->latestMap,&expected,&local_60);
    ashared_ptr<MapWrapper>::~ashared_ptr(&local_60);
    if (!bVar1) {
      MapWrapper::delItem((MapWrapper *)this_00,lat_name);
    }
    ashared_ptr<MapWrapper>::~ashared_ptr(&expected);
    ashared_ptr<MapWrapper>::~ashared_ptr(&new_map);
    bVar4 = lVar3 != 0;
    lVar3 = lVar3 + 1;
  } while (!bVar1 && bVar4);
  ashared_ptr<MapWrapper>::~ashared_ptr(&local_f8);
  return;
}

Assistant:

void addLatency(const std::string& lat_name, uint64_t lat_value) {
        MapWrapperSP cur_map = nullptr;

        size_t ticks_allowed = MAX_ADD_NEW_ITEM_RETRIES;
        do {
            cur_map = latestMap;
            LatencyItem *item = cur_map->get(lat_name);
            if (item) {
                // Found existing latency.
                item->addLatency(lat_value);
                return;
            }

            // Not found,
            // 1) Create a new map containing new stat in an MVCC manner, and
            // 2) Replace 'latestMap' pointer atomically.

            // Note:
            // Below insertion process happens only when a new stat item
            // is added. Generally the number of stats is not pretty big (<100),
            // and adding new stats will be finished at the very early stage.
            // Once all stats are populated in the map, below codes will never
            // be called, and adding new latency will be done without blocking
            // anything.

            // Copy from the current map.
            MapWrapper* new_map_raw = new MapWrapper();
            new_map_raw->copyFrom(*cur_map);
            MapWrapperSP new_map = MapWrapperSP(new_map_raw);

            // Add a new item.
            item = new_map->addItem(lat_name);
            item->addLatency(lat_value);

            // Atomic CAS, from current map to new map
            MapWrapperSP expected = cur_map;
            if (latestMap.compare_exchange(expected, new_map)) {
                // Succeeded.
                return;
            }

            // Failed, other thread updated the map at the same time.
            // Delete newly added item.
            new_map_raw->delItem(lat_name);
            // Retry.
        } while (ticks_allowed--);

        // Update failed, ignore the given latency at this time.
    }